

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

string * chaiscript::Boxed_Number::to_string_aux<float>
                   (string *__return_storage_ptr__,Boxed_Value *v)

{
  float *pfVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  Boxed_Value *v_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pfVar1 = (float *)Boxed_Value::get_const_ptr(v);
  std::ostream::operator<<((ostream *)local_190,*pfVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string_aux(const Boxed_Value &v) {
      std::ostringstream oss;
      oss << *static_cast<const Source *>(v.get_const_ptr());
      return oss.str();
    }